

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringbuffer.h
# Opt level: O2

void __thiscall
rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
          (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,Ch c)

{
  Ch *pCVar1;
  
  pCVar1 = (this->stack_).stackTop_;
  if ((this->stack_).stackEnd_ <= pCVar1 + 1) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(&this->stack_,1);
    pCVar1 = (this->stack_).stackTop_;
  }
  (this->stack_).stackTop_ = pCVar1 + 1;
  *pCVar1 = c;
  return;
}

Assistant:

void Clear() { stack_.Clear(); }